

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIR.cpp
# Opt level: O3

void __thiscall FIR::lowpass(FIR *this,int M,double f)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  setTaps(this,M);
  std::vector<float,_std::allocator<float>_>::resize(&this->freq,1);
  if ((f < 0.0) || (0.5 < f)) {
    puts("\nThe frequency is not normalized");
    return;
  }
  setFreq(this,f,0);
  this->type = 'l';
  if (1 < this->taps) {
    uVar2 = this->taps / 2;
    lVar3 = 0;
    do {
      iVar1 = -uVar2 + (int)lVar3;
      if (iVar1 == 0) {
        if (this->taps <= (int)uVar2) goto LAB_00116da6;
        (this->coeff).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2] = (float)(f + f);
      }
      else {
        dVar5 = (double)iVar1;
        dVar4 = sin(f * 6.283185307179586 * dVar5);
        if ((int)lVar3 < this->taps) {
          (this->coeff).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] = (float)(dVar4 / (dVar5 * 3.141592653589793));
        }
        else {
LAB_00116da6:
          puts("\nThat coefficient does not exist");
        }
      }
      lVar3 = lVar3 + 1;
    } while ((int)(-uVar2 + (int)lVar3) < (int)uVar2);
  }
  return;
}

Assistant:

void FIR::lowpass(int M, double f){
	
	this->setTaps(M);

	freq.resize(1);

	if (f<0.0 or f>0.5){printf("\nThe frequency is not normalized\n");}
	else{
		this->setFreq(f,0);
		this->setType('l');
		int M=this->getTaps();
		int W=M/2;

		for (int i=-W; i<W; i++){
			if (i==0) {
				this->setCoeff(2*f,W);
			}else{		
				this->setCoeff((sin(2*(M_PI)*f*i)/(i*(M_PI))),i+W);
			}
		}
	}
}